

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O1

string * cmVariableWatch::GetAccessAsString_abi_cxx11_(int access_type)

{
  int iVar1;
  
  if (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetAccessAsString[abi:cxx11](int)::
                                 cmVariableWatchAccessStrings_abi_cxx11_);
    if (iVar1 != 0) {
      GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_._M_elems[0].
      _M_dataplus._M_p =
           (pointer)&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                     _M_elems[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_,
                 "READ_ACCESS","");
      GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_._M_elems[1].
      _M_dataplus._M_p =
           (pointer)&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                     _M_elems[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 1),"UNKNOWN_READ_ACCESS","");
      GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_._M_elems[2].
      _M_dataplus._M_p =
           (pointer)&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                     _M_elems[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 2),"UNKNOWN_DEFINED_ACCESS","");
      GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_._M_elems[3].
      _M_dataplus._M_p =
           (pointer)&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                     _M_elems[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 3),"MODIFIED_ACCESS","");
      GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_._M_elems[4].
      _M_dataplus._M_p =
           (pointer)&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                     _M_elems[4].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 4),"REMOVED_ACCESS","");
      GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_._M_elems[5].
      _M_dataplus._M_p =
           (pointer)&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                     _M_elems[5].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 5),"NO_ACCESS","");
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                   ::~array,&GetAccessAsString[abi:cxx11](int)::
                             cmVariableWatchAccessStrings_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetAccessAsString[abi:cxx11](int)::
                           cmVariableWatchAccessStrings_abi_cxx11_);
    }
  }
  iVar1 = 5;
  if ((uint)access_type < 5) {
    iVar1 = access_type;
  }
  return (string *)
         ((long)&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_._M_elems
                 [0]._M_dataplus._M_p + (ulong)(uint)(iVar1 << 5));
}

Assistant:

const std::string& cmVariableWatch::GetAccessAsString(int access_type)
{
  static const std::array<std::string, 6> cmVariableWatchAccessStrings = {
    { "READ_ACCESS", "UNKNOWN_READ_ACCESS", "UNKNOWN_DEFINED_ACCESS",
      "MODIFIED_ACCESS", "REMOVED_ACCESS", "NO_ACCESS" }
  };
  if (access_type < 0 || access_type >= cmVariableWatch::NO_ACCESS) {
    access_type = cmVariableWatch::NO_ACCESS;
  }
  return cmVariableWatchAccessStrings[access_type];
}